

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<int,std::greater<void>>::
k_ary_search_set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (k_ary_search_set<int,std::greater<void>> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,size_t arity,
          value_compare *compare)

{
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  local_40;
  value_compare *local_30;
  value_compare *compare_local;
  size_t arity_local;
  k_ary_search_set<int,_std::greater<void>_> *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_30 = compare;
  compare_local = (value_compare *)arity;
  arity_local = (size_t)this;
  this_local = (k_ary_search_set<int,_std::greater<void>_> *)last._M_current;
  last_local = first;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
  *(value_compare **)(this + 0x18) = compare_local;
  local_40.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
       = (iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
          )boost::
           make_iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (last_local,
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local)
  ;
  initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (this,(iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_40);
  return;
}

Assistant:

k_ary_search_set
                (
                    RandomAccessIterator first,
                    RandomAccessIterator last,
                    std::size_t arity = default_arity,
                    const value_compare & compare = value_compare()
                ):
            m_arity(arity),
            m_compare(compare)
        {
            initialize(boost::make_iterator_range(first, last));
        }